

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

OP1aHeader * __thiscall
ASDCP::MXF::OP1aHeader::WriteToFile(OP1aHeader *this,FileWriter *Writer,ui32_t HeaderSize)

{
  uint uVar1;
  int iVar2;
  ILogSink *pIVar3;
  long *plVar4;
  MDDEntry *pMVar5;
  ui64_t i;
  char *pcVar6;
  uint in_ECX;
  undefined4 in_register_00000014;
  IFileReader *this_00;
  undefined1 *puVar7;
  long *plVar8;
  uint uVar9;
  FrameBuffer HeaderBuffer;
  FrameBuffer WriteWrapper;
  ui32_t write_count;
  Result_t result;
  undefined **local_188;
  byte_t local_180;
  byte_t local_17f [4];
  byte_t abStack_17b [19];
  Result_t local_168 [104];
  Result_t local_100 [104];
  FrameBuffer local_98 [2];
  
  this_00 = (IFileReader *)CONCAT44(in_register_00000014,HeaderSize);
  if (*(long *)(Writer + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x3c5,
                  "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                 );
  }
  if (*(long *)(Writer + 0x210) == 0) {
    puVar7 = Kumu::RESULT_STATE;
LAB_00198eec:
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar7);
    return this;
  }
  if (in_ECX < 0x1000) {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"HeaderSize %u is too small. Must be >= 4096\n",(ulong)in_ECX);
    puVar7 = Kumu::RESULT_PARAM;
    goto LAB_00198eec;
  }
  FrameBuffer::FrameBuffer(&HeaderBuffer);
  iVar2 = (**(code **)(*(long *)Writer + 0x78))(Writer);
  *(ulong *)(Writer + 0xa0) = (ulong)(in_ECX - iVar2);
  FrameBuffer::Capacity((FrameBuffer *)&result,(ui32_t)&HeaderBuffer);
  *(FileWriter **)(*(long *)(Writer + 0x210) + 0x50) = Writer + 0x1b0;
  plVar4 = *(long **)(Writer + 0x70);
  plVar8 = plVar4;
  while (plVar8 = (long *)*plVar8, plVar8 != plVar4) {
    if ((int)_result < 0) goto LAB_001992f7;
    plVar4 = (long *)plVar8[2];
    plVar4[10] = (long)(Writer + 0x1b0);
    FrameBuffer::FrameBuffer(&WriteWrapper);
    FrameBuffer::SetData
              (local_98,(byte_t *)&WriteWrapper,HeaderBuffer.m_Size + (int)HeaderBuffer.m_Data);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    (**(code **)(*plVar4 + 0x70))((Result_t *)&write_count,plVar4,&WriteWrapper);
    Kumu::Result_t::operator=(&result,(Result_t *)&write_count);
    Kumu::Result_t::~Result_t((Result_t *)&write_count);
    HeaderBuffer.m_Size = HeaderBuffer.m_Size + WriteWrapper.m_Size;
    FrameBuffer::~FrameBuffer(&WriteWrapper);
    plVar4 = *(long **)(Writer + 0x70);
  }
  if (-1 < (int)_result) {
    pMVar5 = Dictionary::Type(*(Dictionary **)(Writer + 0x78),MDD_ClosedCompleteHeader);
    WriteWrapper.m_Data._0_1_ = 1;
    WriteWrapper.m_Data._1_7_ = (undefined7)*(undefined8 *)pMVar5->ul;
    WriteWrapper.m_Capacity._0_1_ = (undefined1)((ulong)*(undefined8 *)pMVar5->ul >> 0x38);
    WriteWrapper._17_7_ = SUB87(*(undefined8 *)(pMVar5->ul + 8),0);
    WriteWrapper.m_Size._0_1_ = (undefined1)((ulong)*(undefined8 *)(pMVar5->ul + 8) >> 0x38);
    WriteWrapper._vptr_FrameBuffer = (_func_int **)&PTR__IArchive_002112c8;
    Partition::WriteToFile((Partition *)&write_count,Writer,(UL *)this_00);
    Kumu::Result_t::operator=(&result,(Result_t *)&write_count);
    Kumu::Result_t::~Result_t((Result_t *)&write_count);
    if (-1 < (int)_result) {
      Primer::WriteToFile((Primer *)&write_count,Writer + 0x140);
      Kumu::Result_t::operator=(&result,(Result_t *)&write_count);
      Kumu::Result_t::~Result_t((Result_t *)&write_count);
      if (-1 < (int)_result) {
        Kumu::FileWriter::Write((uchar *)local_100,HeaderSize,(uint *)HeaderBuffer.m_Data);
        Kumu::Result_t::~Result_t(local_100);
        if (write_count != HeaderBuffer.m_Size) {
          __assert_fail("write_count == HeaderBuffer.Size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                        ,0x3ef,
                        "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                       );
        }
        if (-1 < (int)_result) {
          i = Kumu::IFileReader::TellPosition(this_00);
          if (*(long *)(Writer + 0xa0) < (long)i) {
            pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
            pcVar6 = ui64sz(i,(char *)&write_count);
            Kumu::ILogSink::Error
                      (pIVar3,"Header size %s exceeds specified value %u\n",pcVar6,(ulong)in_ECX);
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
            goto LAB_00199309;
          }
          FrameBuffer::FrameBuffer(&WriteWrapper);
          uVar9 = in_ECX - (int)i;
          if (uVar9 < 0x14) {
            pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
            Kumu::ILogSink::Error(pIVar3,"Remaining region too small for KLV Fill header\n");
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
          }
          else {
            pMVar5 = Dictionary::Type(*(Dictionary **)(Writer + 0x78),MDD_KLVFill);
            uVar1 = uVar9 - 0x14;
            local_180 = '\x01';
            local_17f = *(byte_t (*) [4])pMVar5->ul;
            abStack_17b._0_4_ = *(undefined4 *)(pMVar5->ul + 4);
            abStack_17b[4] = pMVar5->ul[8];
            abStack_17b[5] = pMVar5->ul[9];
            abStack_17b[6] = pMVar5->ul[10];
            abStack_17b[7] = pMVar5->ul[0xb];
            abStack_17b._8_4_ = *(undefined4 *)(pMVar5->ul + 0xc);
            local_188 = &PTR__IArchive_002112c8;
            (**(code **)(*(long *)Writer + 0x60))(&write_count,Writer,this_00,&local_188,uVar1);
            Kumu::Result_t::operator=(&result,(Result_t *)&write_count);
            Kumu::Result_t::~Result_t((Result_t *)&write_count);
            if (-1 < (int)_result) {
              FrameBuffer::Capacity((FrameBuffer *)&write_count,(ui32_t)&WriteWrapper);
              Kumu::Result_t::operator=(&result,(Result_t *)&write_count);
              Kumu::Result_t::~Result_t((Result_t *)&write_count);
              if (-1 < (int)_result) {
                memset((void *)CONCAT71(WriteWrapper.m_Data._1_7_,WriteWrapper.m_Data._0_1_),0,
                       (ulong)uVar1);
                Kumu::FileWriter::Write
                          ((uchar *)local_168,HeaderSize,
                           (uint *)CONCAT71(WriteWrapper.m_Data._1_7_,WriteWrapper.m_Data._0_1_));
                Kumu::Result_t::~Result_t(local_168);
                if (write_count != uVar1) {
                  __assert_fail("write_count == klv_fill_length",
                                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                                ,0x414,
                                "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                               );
                }
              }
            }
          }
          FrameBuffer::~FrameBuffer(&WriteWrapper);
          if (uVar9 < 0x14) goto LAB_00199309;
        }
      }
    }
  }
LAB_001992f7:
  Kumu::Result_t::Result_t((Result_t *)this,&result);
LAB_00199309:
  Kumu::Result_t::~Result_t(&result);
  FrameBuffer::~FrameBuffer(&HeaderBuffer);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter& Writer, ui32_t HeaderSize)
{
  assert(m_Dict);
  if ( m_Preface == 0 )
    return RESULT_STATE;

  if ( HeaderSize < 4096 ) 
    {
      DefaultLogSink().Error("HeaderSize %u is too small. Must be >= 4096\n", HeaderSize);
      return RESULT_PARAM;
    }

  ASDCP::FrameBuffer HeaderBuffer;
  HeaderByteCount = HeaderSize - ArchiveSize();
  assert (HeaderByteCount <= 0xFFFFFFFFL);
  Result_t result = HeaderBuffer.Capacity((ui32_t) HeaderByteCount); 
  m_Preface->m_Lookup = &m_Primer;

  std::list<InterchangeObject*>::iterator pl_i = m_PacketList->m_List.begin();
  for ( ; pl_i != m_PacketList->m_List.end() && ASDCP_SUCCESS(result); pl_i++ )
    {
      InterchangeObject* object = *pl_i;
      object->m_Lookup = &m_Primer;

      ASDCP::FrameBuffer WriteWrapper;
      WriteWrapper.SetData(HeaderBuffer.Data() + HeaderBuffer.Size(),
			   HeaderBuffer.Capacity() - HeaderBuffer.Size());
      result = object->WriteToBuffer(WriteWrapper);
      HeaderBuffer.Size(HeaderBuffer.Size() + WriteWrapper.Size());
    }

  if ( ASDCP_SUCCESS(result) )
    {
      UL TmpUL(m_Dict->ul(MDD_ClosedCompleteHeader));
      result = Partition::WriteToFile(Writer, TmpUL);
    }

  if ( ASDCP_SUCCESS(result) )
    result = m_Primer.WriteToFile(Writer);

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t write_count;
      Writer.Write(HeaderBuffer.RoData(), HeaderBuffer.Size(), &write_count);
      assert(write_count == HeaderBuffer.Size());
    }

  // KLV Fill
  if ( ASDCP_SUCCESS(result) )
    {
      Kumu::fpos_t pos = Writer.TellPosition();

      if ( pos > (Kumu::fpos_t)HeaderByteCount )
	{
	  char intbuf[IntBufferLen];
	  DefaultLogSink().Error("Header size %s exceeds specified value %u\n",
				 ui64sz(pos, intbuf),
				 HeaderSize);
	  return RESULT_FAIL;
	}

      ASDCP::FrameBuffer NilBuf;
      ui32_t klv_fill_length = HeaderSize - (ui32_t)pos;

      if ( klv_fill_length < kl_length )
	{
	  DefaultLogSink().Error("Remaining region too small for KLV Fill header\n");
	  return RESULT_FAIL;
	}

      klv_fill_length -= kl_length;
      result = WriteKLToFile(Writer, m_Dict->ul(MDD_KLVFill), klv_fill_length);

      if ( ASDCP_SUCCESS(result) )
	result = NilBuf.Capacity(klv_fill_length);

      if ( ASDCP_SUCCESS(result) )
	{
	  memset(NilBuf.Data(), 0, klv_fill_length);
	  ui32_t write_count;
	  Writer.Write(NilBuf.RoData(), klv_fill_length, &write_count);
	  assert(write_count == klv_fill_length);
	}
    }

  return result;
}